

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_dns_encode_record
              (mbuf *io,mg_dns_resource_record *rr,char *name,size_t nlen,void *rdata,size_t rlen)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint16_t u16;
  char *local_48;
  size_t local_40;
  uint32_t u32;
  
  iVar6 = -1;
  if (rr->kind != MG_DNS_INVALID_RECORD) {
    sVar3 = io->len;
    iVar5 = mg_dns_encode_name(io,name,nlen);
    if (iVar5 != -1) {
      uVar1 = (ushort)rr->rtype;
      u16 = uVar1 << 8 | uVar1 >> 8;
      local_48 = (char *)rdata;
      local_40 = rlen;
      mbuf_append(io,&u16,2);
      uVar1 = (ushort)rr->rclass;
      u16 = uVar1 << 8 | uVar1 >> 8;
      mbuf_append(io,&u16,2);
      if (rr->kind == MG_DNS_ANSWER) {
        uVar2 = rr->ttl;
        u32 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        mbuf_append(io,&u32,4);
        sVar4 = local_40;
        if (rr->rtype == 5) {
          sVar4 = io->len;
          mbuf_append(io,&u16,2);
          iVar6 = mg_dns_encode_name(io,local_48,local_40);
          if (iVar6 == -1) {
            return -1;
          }
          io->buf[sVar4] = (char)((uint)iVar6 >> 8);
          u16._0_1_ = (char)iVar6;
          io->buf[sVar4 + 1] = (char)u16;
        }
        else {
          u16 = (ushort)local_40 << 8 | (ushort)local_40 >> 8;
          mbuf_append(io,&u16,2);
          mbuf_append(io,local_48,sVar4);
        }
      }
      iVar6 = (int)io->len - (int)sVar3;
    }
  }
  return iVar6;
}

Assistant:

int mg_dns_encode_record(struct mbuf *io, struct mg_dns_resource_record *rr,
                         const char *name, size_t nlen, const void *rdata,
                         size_t rlen) {
    size_t pos = io->len;
    uint16_t u16;
    uint32_t u32;

    if (rr->kind == MG_DNS_INVALID_RECORD) {
        return -1; /* LCOV_EXCL_LINE */
    }

    if (mg_dns_encode_name(io, name, nlen) == -1) {
        return -1;
    }

    u16 = htons(rr->rtype);
    mbuf_append(io, &u16, 2);
    u16 = htons(rr->rclass);
    mbuf_append(io, &u16, 2);

    if (rr->kind == MG_DNS_ANSWER) {
        u32 = htonl(rr->ttl);
        mbuf_append(io, &u32, 4);

        if (rr->rtype == MG_DNS_CNAME_RECORD) {
            int clen;
            /* fill size after encoding */
            size_t off = io->len;
            mbuf_append(io, &u16, 2);
            if ((clen = mg_dns_encode_name(io, (const char *) rdata, rlen)) == -1) {
                return -1;
            }
            u16 = clen;
            io->buf[off] = u16 >> 8;
            io->buf[off + 1] = u16 & 0xff;
        } else {
            u16 = htons(rlen);
            mbuf_append(io, &u16, 2);
            mbuf_append(io, rdata, rlen);
        }
    }

    return io->len - pos;
}